

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_1::BaseRenderingCase::BaseRenderingCase
          (BaseRenderingCase *this,Context *context,char *name,char *desc,RenderTarget target,
          int numSamples,int renderSize)

{
  int iVar1;
  RenderTarget *this_00;
  PixelFormat *pPVar2;
  PixelFormat *pPVar3;
  PixelFormat PVar4;
  int numSamples_local;
  RenderTarget target_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  BaseRenderingCase *this_local;
  
  TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseRenderingCase_015924a0;
  this->m_renderSize = renderSize;
  this->m_numSamples = -1;
  this->m_subpixelBits = -1;
  this->m_flatshade = false;
  this->m_numRequestedSamples = numSamples;
  this->m_renderTarget = target;
  this->m_fboInternalFormat = 0x8058;
  pPVar3 = &this->m_pixelFormat;
  if (this->m_renderTarget == RENDERTARGET_DEFAULT) {
    this_00 = Context::getRenderTarget((this->super_TestCase).m_context);
    pPVar2 = tcu::RenderTarget::getPixelFormat(this_00);
    iVar1 = pPVar2->greenBits;
    pPVar3->redBits = pPVar2->redBits;
    pPVar3->greenBits = iVar1;
    iVar1 = pPVar2->alphaBits;
    (this->m_pixelFormat).blueBits = pPVar2->blueBits;
    (this->m_pixelFormat).alphaBits = iVar1;
  }
  else {
    PVar4 = getInternalFormatPixelFormat(this->m_fboInternalFormat);
    *pPVar3 = PVar4;
  }
  this->m_shader = (ShaderProgram *)0x0;
  this->m_fbo = 0;
  this->m_texture = 0;
  this->m_rbo = 0;
  this->m_blitDstFbo = 0;
  this->m_blitDstRbo = 0;
  return;
}

Assistant:

BaseRenderingCase::BaseRenderingCase (Context& context, const char* name, const char* desc, RenderTarget target, int numSamples, int renderSize)
	: TestCase				(context, name, desc)
	, m_renderSize			(renderSize)
	, m_numSamples			(-1)
	, m_subpixelBits		(-1)
	, m_flatshade			(false)
	, m_numRequestedSamples	(numSamples)
	, m_renderTarget		(target)
	, m_fboInternalFormat	(GL_RGBA8)
	, m_pixelFormat			((m_renderTarget == RENDERTARGET_DEFAULT) ? (m_context.getRenderTarget().getPixelFormat()) : (getInternalFormatPixelFormat(m_fboInternalFormat)))
	, m_shader				(DE_NULL)
	, m_fbo					(0)
	, m_texture				(0)
	, m_rbo					(0)
	, m_blitDstFbo			(0)
	, m_blitDstRbo			(0)
{
	DE_ASSERT(m_renderTarget < RENDERTARGET_LAST);
	DE_ASSERT((m_numRequestedSamples == -1) == (m_renderTarget != RENDERTARGET_RBO_MULTISAMPLE));
}